

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall CGL::Application::Application(Application *this,AppConfig *config,bool gl)

{
  float max_tolerance;
  double lensRadius;
  double focalDistance;
  double flare_intensity;
  double flare_radius;
  bool direct_hemisphere_sample;
  size_t ns_aa;
  size_t max_ray_depth;
  size_t ns_area_light;
  size_t ns_diff;
  size_t ns_glsy;
  size_t ns_refr;
  size_t num_threads;
  size_t samples_per_batch;
  HDRImageBuffer *envmap;
  pointer pcVar1;
  RaytracedRenderer *this_00;
  undefined1 auVar2 [12];
  undefined1 auVar4 [12];
  string local_90;
  string local_70;
  string local_50;
  undefined1 auVar3 [32];
  
  (this->super_Renderer)._vptr_Renderer = (_func_int **)&PTR__Application_002a97a8;
  *(code **)&this->camera = strchr;
  Matrix3x3::Matrix3x3((Matrix3x3 *)&this->field_0x60);
  *(undefined8 *)&this->field_0x100 = 0;
  *(undefined8 *)&this->field_0xf0 = 0;
  *(undefined8 *)&this->field_0xf8 = 0;
  *(undefined8 *)&this->field_0x110 = 0;
  *(undefined8 *)&this->field_0x118 = 0;
  *(undefined8 *)&this->field_0x120 = 0;
  *(code **)&this->canonicalCamera = strchr;
  Matrix3x3::Matrix3x3((Matrix3x3 *)&this->field_0x1a0);
  *(undefined8 *)&this->field_0x240 = 0;
  *(undefined8 *)&this->field_0x230 = 0;
  *(undefined8 *)&this->field_0x238 = 0;
  *(undefined8 *)&this->field_0x250 = 0;
  *(undefined8 *)&this->field_0x258 = 0;
  *(undefined8 *)&this->field_0x260 = 0;
  auVar3 = ZEXT432(0) << 0x40;
  auVar2 = auVar3._0_12_;
  auVar4 = auVar3._12_12_;
  (this->defaultStyle).halfedgeColor.r = (float)auVar2._0_4_;
  (this->defaultStyle).halfedgeColor.g = (float)auVar2._4_4_;
  (this->defaultStyle).halfedgeColor.b = (float)auVar2._8_4_;
  (this->defaultStyle).vertexColor.r = (float)auVar4._0_4_;
  (this->defaultStyle).vertexColor.g = (float)auVar4._4_4_;
  (this->defaultStyle).vertexColor.b = (float)auVar4._8_4_;
  (this->defaultStyle).edgeColor.r = (float)auVar3._24_4_;
  (this->defaultStyle).edgeColor.g = (float)auVar3._28_4_;
  *(undefined1 (*) [32])&(this->defaultStyle).vertexColor.g = auVar3;
  auVar3 = ZEXT432(0) << 0x40;
  auVar2 = auVar3._0_12_;
  auVar4 = auVar3._12_12_;
  (this->hoverStyle).halfedgeColor.r = (float)auVar2._0_4_;
  (this->hoverStyle).halfedgeColor.g = (float)auVar2._4_4_;
  (this->hoverStyle).halfedgeColor.b = (float)auVar2._8_4_;
  (this->hoverStyle).vertexColor.r = (float)auVar4._0_4_;
  (this->hoverStyle).vertexColor.g = (float)auVar4._4_4_;
  (this->hoverStyle).vertexColor.b = (float)auVar4._8_4_;
  (this->hoverStyle).edgeColor.r = (float)auVar3._24_4_;
  (this->hoverStyle).edgeColor.g = (float)auVar3._28_4_;
  *(undefined1 (*) [32])&(this->hoverStyle).vertexColor.g = auVar3;
  auVar2 = auVar3._0_12_;
  auVar4 = auVar3._12_12_;
  (this->selectStyle).halfedgeColor.r = (float)auVar2._0_4_;
  (this->selectStyle).halfedgeColor.g = (float)auVar2._4_4_;
  (this->selectStyle).halfedgeColor.b = (float)auVar2._8_4_;
  (this->selectStyle).vertexColor.r = (float)auVar4._0_4_;
  (this->selectStyle).vertexColor.g = (float)auVar4._4_4_;
  (this->selectStyle).vertexColor.b = (float)auVar4._8_4_;
  (this->selectStyle).edgeColor.r = (float)auVar3._24_4_;
  (this->selectStyle).edgeColor.g = (float)auVar3._28_4_;
  *(undefined1 (*) [32])&(this->selectStyle).vertexColor.g = auVar3;
  OSDText::OSDText(&this->textManager);
  (this->text_color).r = 0.0;
  (this->text_color).g = 0.0;
  (this->text_color).b = 0.0;
  (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  this->gl_window = gl;
  this_00 = (RaytracedRenderer *)operator_new(0x2a0);
  ns_aa = config->pathtracer_ns_aa;
  max_ray_depth = config->pathtracer_max_ray_depth;
  ns_area_light = config->pathtracer_ns_area_light;
  ns_diff = config->pathtracer_ns_diff;
  ns_glsy = config->pathtracer_ns_glsy;
  ns_refr = config->pathtracer_ns_refr;
  num_threads = config->pathtracer_num_threads;
  samples_per_batch = config->pathtracer_samples_per_patch;
  max_tolerance = config->pathtracer_max_tolerance;
  envmap = config->pathtracer_envmap;
  direct_hemisphere_sample = config->pathtracer_direct_hemisphere_sample;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar1 = (config->pathtracer_filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + (config->pathtracer_filename)._M_string_length);
  lensRadius = config->pathtracer_lensRadius;
  focalDistance = config->pathtracer_focalDistance;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (config->aperture_filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (config->aperture_filename)._M_string_length);
  flare_intensity = config->pathtracer_lens_flare_intensity;
  flare_radius = config->pathtracer_lens_flare_radius;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (config->ghost_aperture_filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (config->ghost_aperture_filename)._M_string_length)
  ;
  RaytracedRenderer::RaytracedRenderer
            (this_00,ns_aa,max_ray_depth,ns_area_light,ns_diff,ns_glsy,ns_refr,num_threads,
             samples_per_batch,max_tolerance,envmap,direct_hemisphere_sample,&local_90,lensRadius,
             focalDistance,&local_50,flare_radius,flare_intensity,&local_70);
  this->renderer = (OfflineRenderer *)this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  std::__cxx11::string::_M_assign((string *)&this->filename);
  return;
}

Assistant:

Application::Application(AppConfig config, bool gl) {
  gl_window = gl;
  renderer = new RaytracedRenderer (
    config.pathtracer_ns_aa,
    config.pathtracer_max_ray_depth,
    config.pathtracer_ns_area_light,
    config.pathtracer_ns_diff,
    config.pathtracer_ns_glsy,
    config.pathtracer_ns_refr,
    config.pathtracer_num_threads,
    config.pathtracer_samples_per_patch,
    config.pathtracer_max_tolerance,
    config.pathtracer_envmap,
    config.pathtracer_direct_hemisphere_sample,
    config.pathtracer_filename,
    config.pathtracer_lensRadius,
    config.pathtracer_focalDistance,
    config.aperture_filename,
    config.pathtracer_lens_flare_radius,
    config.pathtracer_lens_flare_intensity,
		config.ghost_aperture_filename
  );
  filename = config.pathtracer_filename;
}